

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasDrawLineAA(double x1,double y1,double x2,double y2,Canvas *ptr)

{
  bool bVar1;
  uint x_00;
  uint uVar2;
  uint x_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int local_b8;
  int local_b4;
  int local_a4;
  uint local_90;
  uint local_8c;
  int x_1;
  int x;
  int ypxl2;
  int xpxl2;
  double intery;
  int ypxl1;
  int xpxl1;
  double xgap;
  double yend;
  int xend;
  double gradient;
  double l;
  double dStack_40;
  bool steep;
  double dy;
  double dx;
  Canvas *ptr_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  
  dx = (double)ptr;
  ptr_local = (Canvas *)y2;
  y2_local = x2;
  x2_local = y1;
  y1_local = x1;
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else {
    dy = x2 - x1;
    dStack_40 = y2 - y1;
    abs((int)ptr);
    abs((int)ptr);
    bVar1 = extraout_XMM0_Qa < extraout_XMM0_Qa_00;
    if (bVar1) {
      swap(&y1_local,&x2_local);
      swap(&y2_local,(double *)&ptr_local);
      swap(&dy,&stack0xffffffffffffffc0);
    }
    if (y2_local < y1_local) {
      swap(&y1_local,&y2_local);
      swap(&x2_local,(double *)&ptr_local);
    }
    if (y1_local < 0.0) {
      if (y2_local < 0.0) {
        return;
      }
      dVar3 = -y1_local / (y2_local - y1_local);
      y1_local = 0.0;
      x2_local = x2_local * (1.0 - dVar3) + (double)ptr_local * dVar3;
    }
    if (bVar1) {
      local_a4 = *(int *)((long)dx + 4);
    }
    else {
      local_a4 = *(int *)dx;
    }
    if (y1_local <= (double)local_a4) {
      if (bVar1) {
        local_b4 = *(int *)((long)dx + 4);
      }
      else {
        local_b4 = *(int *)dx;
      }
      if ((double)local_b4 < y2_local) {
        if (bVar1) {
          local_b8 = *(int *)((long)dx + 4);
        }
        else {
          local_b8 = *(int *)dx;
        }
        y2_local = (double)local_b8;
      }
      dVar3 = dStack_40 / dy;
      round(y1_local);
      _ypxl2 = dVar3 * ((double)(int)x_00 - y1_local) + x2_local;
      dVar4 = rfpart(y1_local + 0.5);
      uVar2 = (uint)_ypxl2;
      if (bVar1) {
        dVar5 = rfpart(_ypxl2);
        CanvasDrawPointInternal(uVar2,x_00,dVar5 * dVar4,(Canvas *)dx);
        dVar5 = fpart(_ypxl2);
        CanvasDrawPointInternal(uVar2 + 1,x_00,dVar5 * dVar4,(Canvas *)dx);
      }
      else {
        dVar5 = rfpart(_ypxl2);
        CanvasDrawPointInternal(x_00,uVar2,dVar5 * dVar4,(Canvas *)dx);
        dVar5 = fpart(_ypxl2);
        CanvasDrawPointInternal(x_00,uVar2 + 1,dVar5 * dVar4,(Canvas *)dx);
      }
      _ypxl2 = _ypxl2 + dVar3;
      round(y2_local);
      dVar4 = dVar3 * ((double)(int)x_01 - y2_local) + (double)ptr_local;
      dVar5 = fpart(y2_local + 0.5);
      uVar2 = (uint)dVar4;
      if (bVar1) {
        dVar6 = rfpart(dVar4);
        CanvasDrawPointInternal(uVar2,x_01,dVar6 * dVar5,(Canvas *)dx);
        dVar4 = fpart(dVar4);
        CanvasDrawPointInternal(uVar2 + 1,x_01,dVar4 * dVar5,(Canvas *)dx);
        local_8c = x_00;
        while (local_8c = local_8c + 1, (int)local_8c < (int)x_01) {
          dVar4 = rfpart(_ypxl2);
          CanvasDrawPointInternal((int)_ypxl2,local_8c,dVar4,(Canvas *)dx);
          dVar4 = fpart(_ypxl2);
          CanvasDrawPointInternal((int)_ypxl2 + 1,local_8c,dVar4,(Canvas *)dx);
          _ypxl2 = _ypxl2 + dVar3;
        }
      }
      else {
        dVar6 = rfpart(dVar4);
        CanvasDrawPointInternal(x_01,uVar2,dVar6 * dVar5,(Canvas *)dx);
        dVar4 = fpart(dVar4);
        CanvasDrawPointInternal(x_01,uVar2 + 1,dVar4 * dVar5,(Canvas *)dx);
        local_90 = x_00;
        while (local_90 = local_90 + 1, (int)local_90 < (int)x_01) {
          dVar4 = rfpart(_ypxl2);
          CanvasDrawPointInternal(local_90,(int)_ypxl2,dVar4,(Canvas *)dx);
          dVar4 = fpart(_ypxl2);
          CanvasDrawPointInternal(local_90,(int)_ypxl2 + 1,dVar4,(Canvas *)dx);
          _ypxl2 = _ypxl2 + dVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void CanvasDrawLineAA(double x1, double y1, double x2, double y2, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		double dx = x2 - x1;
		double dy = y2 - y1;
		bool steep = false;
		if(abs(dx) < abs(dy))
		{			
			swap(x1, y1);
			swap(x2, y2);
			swap(dx, dy);
			steep = true;
		}
		if(x2 < x1)
		{
			swap(x1, x2);
			swap(y1, y2);
		}
		if(x1 < 0.0)
		{
			if(x2 < 0.0)
				return;
			double l = -x1 / (x2 - x1);
			x1 = 0.0;
			y1 = y1 * (1.0 - l) + y2 * l;
		}
		if(x1 > (steep ? ptr->height : ptr->width))
			return;
		if(x2 > (steep ? ptr->height : ptr->width))
			x2 = steep ? ptr->height : ptr->width;
		double gradient = dy / dx;

		// handle first endpoint
		int xend = round(x1);
		double yend = y1 + gradient * (xend - x1);
		double xgap = rfpart(x1 + 0.5);
		int xpxl1 = xend;
		int ypxl1 = int(yend);
		if(steep)
		{
			CanvasDrawPointInternal(ypxl1, xpxl1, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(ypxl1 + 1, xpxl1, fpart(yend) * xgap, ptr);
		}else{
			CanvasDrawPointInternal(xpxl1, ypxl1, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(xpxl1, ypxl1 + 1, fpart(yend) * xgap, ptr);
		}
		double intery = yend + gradient; // first y-intersection for the main loop

		// handle second endpoint
		xend = round(x2);
		yend = y2 + gradient * (xend - x2);
		xgap = fpart(x2 + 0.5);
		int xpxl2 = xend ; // this will be used in the main loop
		int ypxl2 = int(yend);
		if(steep)
		{
			CanvasDrawPointInternal(ypxl2, xpxl2, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(ypxl2 + 1, xpxl2, fpart(yend) * xgap, ptr);
		}else{
			CanvasDrawPointInternal(xpxl2, ypxl2, rfpart(yend) * xgap, ptr);
			CanvasDrawPointInternal(xpxl2, ypxl2 + 1, fpart(yend) * xgap, ptr);
		}

		if(steep)
		{
			for(int x = xpxl1 + 1; x < xpxl2; x++)
			{
				CanvasDrawPointInternal(int(intery), x, rfpart(intery), ptr);
				CanvasDrawPointInternal(int(intery) + 1, x, fpart(intery), ptr);
				intery = intery + gradient;
			}
		}else{
			for(int x = xpxl1 + 1; x < xpxl2; x++)
			{
				CanvasDrawPointInternal(x, int(intery), rfpart(intery), ptr);
				CanvasDrawPointInternal(x, int(intery) + 1, fpart(intery), ptr);
				intery = intery + gradient;
			}
		}
	}